

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_internal.c
# Opt level: O0

int mbedtls_rsa_deduce_crt
              (mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *D,mbedtls_mpi *DP,mbedtls_mpi *DQ,
              mbedtls_mpi *QP)

{
  undefined1 local_58 [8];
  mbedtls_mpi K;
  int ret;
  mbedtls_mpi *QP_local;
  mbedtls_mpi *DQ_local;
  mbedtls_mpi *DP_local;
  mbedtls_mpi *D_local;
  mbedtls_mpi *Q_local;
  mbedtls_mpi *P_local;
  
  K.p._4_4_ = 0;
  mbedtls_mpi_init((mbedtls_mpi *)local_58);
  if ((((DP == (mbedtls_mpi *)0x0) ||
       ((K.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)local_58,P,1), K.p._4_4_ == 0 &&
        (K.p._4_4_ = mbedtls_mpi_mod_mpi(DP,D,(mbedtls_mpi *)local_58), K.p._4_4_ == 0)))) &&
      ((DQ == (mbedtls_mpi *)0x0 ||
       ((K.p._4_4_ = mbedtls_mpi_sub_int((mbedtls_mpi *)local_58,Q,1), K.p._4_4_ == 0 &&
        (K.p._4_4_ = mbedtls_mpi_mod_mpi(DQ,D,(mbedtls_mpi *)local_58), K.p._4_4_ == 0)))))) &&
     (QP != (mbedtls_mpi *)0x0)) {
    K.p._4_4_ = mbedtls_mpi_inv_mod(QP,Q,P);
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_58);
  return K.p._4_4_;
}

Assistant:

int mbedtls_rsa_deduce_crt( const mbedtls_mpi *P, const mbedtls_mpi *Q,
                            const mbedtls_mpi *D, mbedtls_mpi *DP,
                            mbedtls_mpi *DQ, mbedtls_mpi *QP )
{
    int ret = 0;
    mbedtls_mpi K;
    mbedtls_mpi_init( &K );

    /* DP = D mod P-1 */
    if( DP != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, P, 1  ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( DP, D, &K ) );
    }

    /* DQ = D mod Q-1 */
    if( DQ != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, Q, 1  ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( DQ, D, &K ) );
    }

    /* QP = Q^{-1} mod P */
    if( QP != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( QP, Q, P ) );
    }

cleanup:
    mbedtls_mpi_free( &K );

    return( ret );
}